

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Octree.cpp
# Opt level: O0

void __thiscall
Octree::CmdTransferOwnership
          (Octree *this,shared_ptr<myvk::CommandBuffer> *command_buffer,uint32_t src_queue_family,
          uint32_t dst_queue_family,VkPipelineStageFlags src_stage,VkPipelineStageFlags dst_stage)

{
  initializer_list<VkBufferMemoryBarrier> __l;
  element_type *this_00;
  BufferBase *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  undefined8 in_stack_ffffffffffffff08;
  uint32_t src_queue_family_00;
  allocator_type *in_stack_ffffffffffffff28;
  vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *in_stack_ffffffffffffff30;
  iterator in_stack_ffffffffffffff38;
  vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *in_stack_ffffffffffffff40;
  vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *in_stack_ffffffffffffff48;
  vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *in_stack_ffffffffffffff50;
  undefined8 uVar1;
  CommandBuffer *this_01;
  undefined1 local_98 [56];
  undefined1 *local_60;
  undefined8 local_58;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined4 local_20;
  undefined4 local_1c;
  
  src_queue_family_00 = (uint32_t)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  local_20 = in_R9D;
  local_1c = in_R8D;
  this_00 = std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1676ef);
  local_38 = 0;
  uStack_30 = 0;
  local_28 = 0;
  std::vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::vector
            ((vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)0x16772e);
  std::__shared_ptr_access<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x167738
            );
  uVar1 = 0;
  this_01 = (CommandBuffer *)
            (in_RDI->super_DeviceObjectBase).super_Base.super_enable_shared_from_this<myvk::Base>.
            _M_weak_this.super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  myvk::BufferBase::GetMemoryBarrier
            (in_RDI,(BufferSubresourceRange *)CONCAT44(local_20,local_1c),
             (VkAccessFlags)((ulong)this_00 >> 0x20),(VkAccessFlags)this_00,src_queue_family_00,
             (uint32_t)in_stack_ffffffffffffff30);
  local_60 = local_98;
  local_58 = 1;
  std::allocator<VkBufferMemoryBarrier>::allocator((allocator<VkBufferMemoryBarrier> *)0x1677a5);
  __l._M_len = (size_type)in_stack_ffffffffffffff40;
  __l._M_array = in_stack_ffffffffffffff38;
  std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::vector
            (in_stack_ffffffffffffff30,__l,in_stack_ffffffffffffff28);
  std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::vector
            ((vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)0x1677e9);
  myvk::CommandBuffer::CmdPipelineBarrier
            (this_01,(VkPipelineStageFlags)((ulong)uVar1 >> 0x20),(VkPipelineStageFlags)uVar1,
             in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::~vector
            ((vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)this_00);
  std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::~vector
            ((vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)this_00);
  std::allocator<VkBufferMemoryBarrier>::~allocator
            ((allocator<VkBufferMemoryBarrier> *)&stack0xffffffffffffff4b);
  std::vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::~vector
            ((vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)this_00);
  return;
}

Assistant:

void Octree::CmdTransferOwnership(const std::shared_ptr<myvk::CommandBuffer> &command_buffer, uint32_t src_queue_family,
                                  uint32_t dst_queue_family, VkPipelineStageFlags src_stage,
                                  VkPipelineStageFlags dst_stage) const {
	command_buffer->CmdPipelineBarrier(
	    src_stage, dst_stage, {}, {m_buffer->GetMemoryBarrier({0, m_range}, 0, 0, src_queue_family, dst_queue_family)},
	    {});
}